

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O1

vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
* __thiscall
spvtools::opt::StructPackingPass::findStructMemberTypes
          (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
           *__return_storage_ptr__,StructPackingPass *this,Instruction *structDef)

{
  pointer pOVar1;
  IRContext *this_00;
  uint32_t id;
  ulong uVar2;
  Type *pTVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = (int)((long)(structDef->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(structDef->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x55555555;
  if (iVar5 == 0) {
    __assert_fail("structDef.NumOperands() > 0 && \"Number of operands in OpTypeStruct instruction must not be zero\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/struct_packing_pass.cpp"
                  ,0x18b,
                  "std::vector<const analysis::Type *> spvtools::opt::StructPackingPass::findStructMemberTypes(const Instruction &) const"
                 );
  }
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ::resize(__return_storage_ptr__,(ulong)(iVar5 - 1U));
  if (iVar5 - 1U != 0) {
    uVar4 = 1;
    lVar6 = 0x30;
    do {
      pOVar1 = (structDef->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(structDef->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4) *
              -0x5555555555555555;
      if (uVar2 < uVar4 || uVar2 - uVar4 == 0) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2a5,"const Operand &spvtools::opt::Instruction::GetOperand(uint32_t) const"
                     );
      }
      id = Operand::AsId((Operand *)((long)((pOVar1->words).buffer + 0xfffffffffffffffa) + lVar6));
      this_00 = (this->super_Pass).context_;
      if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
        IRContext::BuildTypeManager(this_00);
      }
      pTVar3 = analysis::TypeManager::GetType
                         ((this_00->type_mgr_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                          _M_head_impl,id);
      if (pTVar3 != (Type *)0x0) {
        (__return_storage_ptr__->
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar4 - 1] = pTVar3;
      }
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0x30;
    } while (iVar5 != (int)uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const analysis::Type*> StructPackingPass::findStructMemberTypes(
    const Instruction& structDef) const {
  // Found struct type to pack, now collect all types of its members
  assert(structDef.NumOperands() > 0 &&
         "Number of operands in OpTypeStruct instruction must not be zero");
  const uint32_t numMembers = structDef.NumOperands() - 1;
  std::vector<const analysis::Type*> structMemberTypes;
  structMemberTypes.resize(numMembers);
  for (uint32_t i = 0; i < numMembers; ++i) {
    const spv::Id memberTypeId = structDef.GetOperand(1 + i).AsId();
    if (const analysis::Type* memberType =
            context()->get_type_mgr()->GetType(memberTypeId)) {
      structMemberTypes[i] = memberType;
    }
  }
  return structMemberTypes;
}